

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StringAggDeserialize(Deserializer *deserializer,AggregateFunction *bound_function)

{
  _func_int **pp_Var1;
  type ret;
  _func_int **local_50;
  _func_int *local_48;
  _func_int *local_40;
  _func_int *p_Stack_38;
  _func_int *local_20;
  _func_int *p_Stack_18;
  
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2]
  )(bound_function,100,"separator");
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
    [0x1a])(&local_50,bound_function);
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3]
  )(bound_function);
  pp_Var1 = (_func_int **)operator_new(0x28);
  if (local_50 == &local_40) {
    p_Stack_18 = p_Stack_38;
    local_50 = &local_20;
  }
  *pp_Var1 = (_func_int *)&PTR__StringAggBindData_019a3ba8;
  pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
  if (local_50 == &local_20) {
    pp_Var1[3] = local_40;
    pp_Var1[4] = p_Stack_18;
  }
  else {
    pp_Var1[1] = (_func_int *)local_50;
    pp_Var1[3] = local_40;
  }
  pp_Var1[2] = local_48;
  deserializer->_vptr_Deserializer = pp_Var1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> StringAggDeserialize(Deserializer &deserializer, AggregateFunction &bound_function) {
	auto sep = deserializer.ReadProperty<string>(100, "separator");
	return make_uniq<StringAggBindData>(std::move(sep));
}